

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void exp_repeat_push(lyxp_expr *exp,uint16_t exp_idx,uint16_t repeat_op_idx)

{
  lyxp_expr_type *plVar1;
  ushort local_16;
  uint16_t i;
  uint16_t repeat_op_idx_local;
  uint16_t exp_idx_local;
  lyxp_expr *exp_local;
  
  if (exp->repeat[exp_idx] == (lyxp_expr_type *)0x0) {
    plVar1 = (lyxp_expr_type *)calloc(2,4);
    exp->repeat[exp_idx] = plVar1;
    if (exp->repeat[exp_idx] == (lyxp_expr_type *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","exp_repeat_push");
    }
    else {
      *exp->repeat[exp_idx] = (uint)repeat_op_idx;
    }
  }
  else {
    for (local_16 = 0; exp->repeat[exp_idx][local_16] != LYXP_EXPR_NONE; local_16 = local_16 + 1) {
    }
    plVar1 = (lyxp_expr_type *)realloc(exp->repeat[exp_idx],(long)(int)(local_16 + 2) << 2);
    exp->repeat[exp_idx] = plVar1;
    if (exp->repeat[exp_idx] == (lyxp_expr_type *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","exp_repeat_push");
    }
    else {
      exp->repeat[exp_idx][local_16] = (uint)repeat_op_idx;
      exp->repeat[exp_idx][(int)(local_16 + 1)] = LYXP_EXPR_NONE;
    }
  }
  return;
}

Assistant:

static void
exp_repeat_push(struct lyxp_expr *exp, uint16_t exp_idx, uint16_t repeat_op_idx)
{
    uint16_t i;

    if (exp->repeat[exp_idx]) {
        for (i = 0; exp->repeat[exp_idx][i]; ++i);
        exp->repeat[exp_idx] = realloc(exp->repeat[exp_idx], (i + 2) * sizeof *exp->repeat[exp_idx]);
        LY_CHECK_ERR_RETURN(!exp->repeat[exp_idx], LOGMEM(NULL), );
        exp->repeat[exp_idx][i] = repeat_op_idx;
        exp->repeat[exp_idx][i + 1] = 0;
    } else {
        exp->repeat[exp_idx] = calloc(2, sizeof *exp->repeat[exp_idx]);
        LY_CHECK_ERR_RETURN(!exp->repeat[exp_idx], LOGMEM(NULL), );
        exp->repeat[exp_idx][0] = repeat_op_idx;
    }
}